

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_sign.c
# Opt level: O0

int crypto_sign_keypair(uchar *pk,uchar *sk)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int ret;
  picnic_privatekey_t psk;
  picnic_publickey_t ppk;
  undefined1 local_ba [97];
  undefined1 local_59 [65];
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_4 = picnic_keygen(0xc,local_59,local_ba);
  if (local_4 == 0) {
    iVar1 = picnic_write_public_key(local_59,local_10,0x41);
    if (iVar1 < 0) {
      picnic_clear_private_key(local_ba);
      local_4 = iVar1;
    }
    else {
      iVar1 = picnic_write_private_key(local_ba,local_18,0x61);
      picnic_clear_private_key(local_ba);
      local_4 = iVar1;
      if (-1 < iVar1) {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int crypto_sign_keypair(unsigned char* pk, unsigned char* sk) {
  picnic_publickey_t ppk;
  picnic_privatekey_t psk;

  int ret = picnic_keygen(Picnic_L5_full, &ppk, &psk);
  if (ret) {
    return ret;
  }

  ret = picnic_write_public_key(&ppk, pk, PICNIC_PUBLIC_KEY_SIZE(Picnic_L5_full));
  if (ret < 0) {
    picnic_clear_private_key(&psk);
    return ret;
  }

  ret = picnic_write_private_key(&psk, sk, PICNIC_PRIVATE_KEY_SIZE(Picnic_L5_full));
  picnic_clear_private_key(&psk);
  if (ret < 0) {
    return ret;
  }

  return 0;
}